

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcodecompile.cc
# Opt level: O2

void __thiscall PcodeCompile::newLocalDefinition(PcodeCompile *this,string *varname,uint4 size)

{
  anon_union_8_2_16792c89_for_value aVar1;
  VarnodeTpl *pVVar2;
  VarnodeSymbol *this_00;
  ConstTpl local_48;
  
  pVVar2 = buildTemporary(this);
  if (size != 0) {
    ConstTpl::ConstTpl(&local_48,real,(ulong)size);
    aVar1._4_4_ = local_48.value._4_4_;
    aVar1.handle_index = local_48.value.handle_index;
    *(ulong *)((long)&(pVVar2->size).value + 4) =
         CONCAT44((undefined4)local_48.value_real,local_48.value._4_4_);
    *(undefined8 *)((long)&(pVVar2->size).value_real + 4) = local_48._20_8_;
    (pVVar2->size).type = local_48.type;
    *(undefined4 *)&(pVVar2->size).field_0x4 = local_48._4_4_;
    (pVVar2->size).value = aVar1;
  }
  this_00 = (VarnodeSymbol *)operator_new(0x58);
  VarnodeSymbol::VarnodeSymbol
            (this_00,varname,(pVVar2->space).value.spaceid,(pVVar2->offset).value_real,
             (int4)(pVVar2->size).value_real);
  (*this->_vptr_PcodeCompile[1])(this,this_00);
  std::__cxx11::string::~string((string *)varname);
  operator_delete(varname);
  return;
}

Assistant:

void PcodeCompile::newLocalDefinition(string *varname,uint4 size)

{ // Create a new temporary symbol (without generating any pcode)
  VarnodeSymbol *sym;
  VarnodeTpl *tmpvn = buildTemporary();
  if (size != 0)
    tmpvn->setSize(ConstTpl(ConstTpl::real,size)); // Size was explicitly specified
  sym = new VarnodeSymbol(*varname,tmpvn->getSpace().getSpace(),tmpvn->getOffset().getReal(),tmpvn->getSize().getReal());
  addSymbol(sym);
  delete varname;
}